

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_event clCreateUserEvent(cl_context context,cl_int *errcode_ret)

{
  time_point start;
  bool bVar1;
  CLIntercept *this;
  cl_icd_dispatch *pcVar2;
  uint64_t enqueueCounter_00;
  SConfig *pSVar3;
  uint *in_RSI;
  cl_context in_RDI;
  cl_event retVal;
  time_point cpuEnd;
  time_point cpuStart;
  cl_int localErrorCode;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  cl_int in_stack_00000114;
  char *in_stack_00000118;
  CLIntercept *in_stack_00000120;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff00;
  CLIntercept *in_stack_ffffffffffffff08;
  allocator *paVar4;
  CLIntercept *in_stack_ffffffffffffff10;
  CObjectTracker *in_stack_ffffffffffffff18;
  int local_dc;
  duration local_d8;
  char *local_d0;
  allocator local_c1;
  string local_c0 [32];
  CLIntercept *local_a0;
  duration local_98;
  undefined1 local_79 [9];
  uint64_t in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff9f;
  string *in_stack_ffffffffffffffa0;
  CLIntercept *in_stack_ffffffffffffffa8;
  time_point in_stack_ffffffffffffffb8;
  duration in_stack_ffffffffffffffc0;
  time_point in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  uint *local_18;
  CLIntercept *local_8;
  
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pcVar2 = CLIntercept::dispatch(this),
     pcVar2->clCreateUserEvent == (cl_api_clCreateUserEvent)0x0)) {
    local_dc = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_dc);
    if (in_RSI != (uint *)0x0) {
      *in_RSI = 0xffffffde;
    }
    local_8 = (CLIntercept *)0x0;
  }
  else {
    enqueueCounter_00 = CLIntercept::getEnqueueCounter(in_stack_ffffffffffffff08);
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingEnter
                (this,"clCreateUserEvent",enqueueCounter_00,(cl_kernel)0x0,"context = %p",in_RDI);
    }
    uVar5 = 0;
    pSVar3 = CLIntercept::config(this);
    local_18 = in_RSI;
    if ((((((pSVar3->CallLogging & 1U) != 0) ||
          (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorLogging & 1U) != 0)) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->NoErrors & 1U) != 0)) &&
       (in_RSI == (uint *)0x0)) {
      local_18 = (uint *)&stack0xffffffffffffffd4;
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_ffffffffffffff00);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_ffffffffffffff00);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffb8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc8.__d.__r = in_stack_ffffffffffffffb8.__d.__r;
    }
    pcVar2 = CLIntercept::dispatch(this);
    local_8 = (CLIntercept *)(*pcVar2->clCreateUserEvent)(in_RDI,(cl_int *)local_18);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffa8 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc0.__r = (rep)in_stack_ffffffffffffffa8;
      pSVar3 = CLIntercept::config(this);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,enqueueCounter_00),
         bVar1)) {
        in_stack_ffffffffffffff18 = (CObjectTracker *)local_79;
        in_stack_ffffffffffffff10 = this;
        std::allocator<char>::allocator();
        local_a0 = (CLIntercept *)in_stack_ffffffffffffffc0.__r;
        local_98 = in_stack_ffffffffffffffc8.__d.__r;
        std::__cxx11::string::string
                  ((string *)(local_79 + 1),"",(allocator *)in_stack_ffffffffffffff18);
        start.__d.__r._4_4_ = uVar5;
        start.__d.__r._0_4_ = in_stack_ffffffffffffffd0;
        in_stack_ffffffffffffffc0.__r = (rep)local_a0;
        in_stack_ffffffffffffffc8.__d.__r = (duration)(duration)local_98.__r;
        CLIntercept::updateHostTimingStats
                  (local_a0,(char *)in_stack_ffffffffffffffb8.__d.__r,(string *)local_8,start,
                   (time_point)local_98.__r);
        std::__cxx11::string::~string((string *)(local_79 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_79);
      }
    }
    pSVar3 = CLIntercept::config(this);
    if (((((pSVar3->ErrorLogging & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->NoErrors & 1U) != 0)) && (*local_18 != 0)) {
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000120,in_stack_00000118,in_stack_00000114);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->NoErrors & 1U) != 0) {
        *local_18 = 0;
      }
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->LeakChecking & 1U) != 0) {
      CLIntercept::objectTracker(this);
      CObjectTracker::AddAllocation<_cl_event*>
                (in_stack_ffffffffffffff18,(_cl_event *)in_stack_ffffffffffffff10);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (this,"clCreateUserEvent",(cl_int)(ulong)*local_18,(cl_event *)0x0,
                 (cl_sync_point_khr *)0x0,"returned %p",local_8);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->ChromeCallLogging & 1U) != 0) {
      paVar4 = &local_c1;
      std::allocator<char>::allocator();
      local_d8.__r = in_stack_ffffffffffffffc0.__r;
      local_d0 = (char *)in_stack_ffffffffffffffc8.__d.__r;
      std::__cxx11::string::string(local_c0,"",paVar4);
      CLIntercept::chromeCallLoggingExit
                (local_8,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (bool)in_stack_ffffffffffffff9f,in_stack_ffffffffffffff90,(time_point)local_d8.__r,
                 in_stack_ffffffffffffffb8);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
  }
  return (cl_event)local_8;
}

Assistant:

CL_API_ENTRY cl_event CL_API_CALL CLIRN(clCreateUserEvent)(
    cl_context context,
    cl_int *errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clCreateUserEvent )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "context = %p",
            context );
        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_event    retVal = pIntercept->dispatch().clCreateUserEvent(
            context,
            errcode_ret );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}